

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMvMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  vfloat<4> vVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar10;
  undefined1 auVar11 [16];
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  ulong uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  vbool<4> vVar23;
  uint uVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  undefined4 uVar27;
  long lVar28;
  ulong uVar29;
  NodeRef root;
  size_t sVar30;
  uint uVar31;
  ulong uVar32;
  NodeRef *pNVar33;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_ZMM0 [64];
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar57;
  float fVar59;
  float fVar60;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar58;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar56;
  undefined1 auVar55 [64];
  float fVar61;
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  float fVar77;
  float fVar80;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar79;
  float fVar81;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar76;
  float fVar78;
  undefined1 auVar75 [64];
  vint4 ai_2;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  vint4 bi_1;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  vint4 bi_3;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  float fVar109;
  float fVar110;
  float fVar111;
  float fVar120;
  float fVar122;
  float fVar123;
  float fVar125;
  vint4 bi;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  float fVar126;
  undefined1 auVar118 [16];
  float fVar121;
  float fVar124;
  float fVar127;
  undefined1 auVar119 [16];
  float fVar128;
  vint4 bi_2;
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar132;
  float fVar133;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  float fVar144;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar154;
  float fVar156;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar155;
  float fVar157;
  undefined1 auVar153 [16];
  float fVar158;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar163;
  undefined1 auVar164 [16];
  float fVar165;
  float fVar166;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  vint4 ai;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar174;
  undefined1 auVar169 [16];
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar179;
  vint4 ai_1;
  undefined1 auVar177 [16];
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  float fVar186;
  float fVar188;
  vint4 ai_3;
  undefined1 auVar184 [16];
  float fVar187;
  float fVar189;
  float fVar190;
  float fVar191;
  undefined1 auVar185 [16];
  Precalculations pre;
  float local_3838;
  float fStack_3834;
  float fStack_3830;
  float local_3808;
  float fStack_3804;
  float fStack_3800;
  vbool<4> terminated;
  undefined8 uStack_37d0;
  float local_37c8;
  float fStack_37c4;
  float fStack_37c0;
  undefined1 local_37b8 [16];
  BVH *local_37a8;
  Intersectors *local_37a0;
  RTCFilterFunctionNArguments args;
  TravRayK<4,_true> tray;
  undefined1 local_3668 [16];
  undefined1 local_3658 [16];
  undefined1 local_3648 [16];
  undefined1 local_3638 [16];
  undefined1 local_3628 [16];
  undefined1 local_3618 [8];
  float fStack_3610;
  float fStack_360c;
  undefined8 local_3608;
  undefined8 uStack_3600;
  undefined8 local_3568;
  undefined8 uStack_3560;
  undefined8 local_3558;
  undefined8 uStack_3550;
  undefined1 local_3548 [16];
  undefined1 local_3538 [16];
  undefined1 local_3528 [16];
  undefined1 local_3518 [16];
  undefined1 local_3508 [16];
  uint local_34f8;
  uint uStack_34f4;
  uint uStack_34f0;
  uint uStack_34ec;
  uint uStack_34e8;
  uint uStack_34e4;
  uint uStack_34e0;
  uint uStack_34dc;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  undefined1 auVar152 [16];
  
  local_37a8 = (BVH *)This->ptr;
  stack_node[1].ptr = (local_37a8->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar41 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar63 = vpcmpeqd_avx(auVar41,(undefined1  [16])valid_i->field_0);
    auVar51 = ZEXT816(0) << 0x40;
    auVar11 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar51,5);
    auVar90 = auVar63 & auVar11;
    if ((((auVar90 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar90 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar90 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar90[0xf] < '\0')
    {
      auVar11 = vandps_avx(auVar11,auVar63);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar134._8_4_ = 0x7fffffff;
      auVar134._0_8_ = 0x7fffffff7fffffff;
      auVar134._12_4_ = 0x7fffffff;
      auVar63 = vandps_avx(auVar134,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar148._8_4_ = 0x219392ef;
      auVar148._0_8_ = 0x219392ef219392ef;
      auVar148._12_4_ = 0x219392ef;
      auVar90 = vcmpps_avx(auVar63,auVar148,1);
      auVar164._8_4_ = 0x3f800000;
      auVar164._0_8_ = 0x3f8000003f800000;
      auVar164._12_4_ = 0x3f800000;
      auVar99 = vdivps_avx(auVar164,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar63 = vandps_avx(auVar134,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar53 = vcmpps_avx(auVar63,auVar148,1);
      auVar112 = vdivps_avx(auVar164,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar63 = vandps_avx(auVar134,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar63 = vcmpps_avx(auVar63,auVar148,1);
      auVar113 = vdivps_avx(auVar164,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar149._8_4_ = 0x5d5e0b6b;
      auVar149._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar149._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar99,auVar149,auVar90);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar112,auVar149,auVar53)
      ;
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar113,auVar149,auVar63)
      ;
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar51,1);
      auVar112._8_4_ = 0x20;
      auVar112._0_8_ = 0x2000000020;
      auVar112._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar63,auVar112);
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar51,5);
      auVar90._8_4_ = 0x40;
      auVar90._0_8_ = 0x4000000040;
      auVar90._12_4_ = 0x40;
      auVar113._8_4_ = 0x60;
      auVar113._0_8_ = 0x6000000060;
      auVar113._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 = (vint_impl<4>)vblendvps_avx(auVar113,auVar90,auVar63)
      ;
      auVar63 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar51,5);
      auVar53._8_4_ = 0x80;
      auVar53._0_8_ = 0x8000000080;
      auVar53._12_4_ = 0x80;
      auVar99._8_4_ = 0xa0;
      auVar99._0_8_ = 0xa0000000a0;
      auVar99._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 = (vint_impl<4>)vblendvps_avx(auVar99,auVar53,auVar63);
      auVar63 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar51);
      auVar90 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar51);
      auVar51._8_4_ = 0x7f800000;
      auVar51._0_8_ = 0x7f8000007f800000;
      auVar51._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar51,auVar63,auVar11);
      auVar63._8_4_ = 0xff800000;
      auVar63._0_8_ = 0xff800000ff800000;
      auVar63._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar63,auVar90,auVar11);
      terminated.field_0.i[1] = auVar11._4_4_ ^ auVar41._4_4_;
      terminated.field_0.i[0] = auVar11._0_4_ ^ auVar41._0_4_;
      terminated.field_0.i[2] = auVar11._8_4_ ^ auVar41._8_4_;
      terminated.field_0.i[3] = auVar11._12_4_ ^ auVar41._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar31 = 3;
      }
      else {
        uVar31 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar33 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar34 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
      auVar41 = vpcmpeqd_avx((undefined1  [16])tray.tnear.field_0,
                             (undefined1  [16])tray.tnear.field_0);
      auVar55 = ZEXT1664(auVar41);
      local_37a0 = This;
LAB_0153c631:
      do {
        do {
          root.ptr = pNVar33[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_0153d326;
          pNVar33 = pNVar33 + -1;
          paVar34 = paVar34 + -1;
          vVar5.field_0 = *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar34->v;
          auVar75 = ZEXT1664((undefined1  [16])vVar5.field_0);
          auVar41 = vcmpps_avx((undefined1  [16])vVar5.field_0,(undefined1  [16])tray.tfar.field_0,1
                              );
          uVar24 = vmovmskps_avx(auVar41);
        } while (uVar24 == 0);
        uVar26 = (ulong)(uVar24 & 0xff);
        uVar24 = POPCOUNT(uVar24 & 0xff);
        if (uVar31 < uVar24) {
LAB_0153c671:
          do {
            vVar23.field_0 = terminated.field_0;
            auVar41 = auVar55._0_16_;
            uVar24 = (uint)root.ptr;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_0153d326;
              auVar63 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar75._0_16_,6);
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar63[0xf]) goto LAB_0153c631;
              uVar26 = (ulong)(uVar24 & 0xf);
              if (uVar26 == 8) goto LAB_0153d221;
              lVar28 = (root.ptr & 0xfffffffffffffff0) + 0x130;
              uVar32 = 0;
              auVar63 = (undefined1  [16])terminated.field_0 ^ auVar41;
              goto LAB_0153c95c;
            }
            uVar26 = root.ptr & 0xfffffffffffffff0;
            lVar28 = -0x20;
            auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar75._0_16_,6);
            auVar43._8_4_ = 0x7f800000;
            auVar43._0_8_ = 0x7f8000007f800000;
            auVar43._12_4_ = 0x7f800000;
            sVar30 = 8;
            do {
              root.ptr = *(size_t *)(uVar26 + 0x40 + lVar28 * 2);
              if (root.ptr == 8) {
                auVar75 = ZEXT1664(auVar43);
                root.ptr = sVar30;
                break;
              }
              fVar2 = *(float *)(uVar26 + 0x120 + lVar28);
              fVar3 = *(float *)(uVar26 + 0x60 + lVar28);
              auVar63 = *(undefined1 (*) [16])(ray + 0x70);
              fVar61 = auVar63._0_4_;
              fVar76 = auVar63._4_4_;
              fVar79 = auVar63._8_4_;
              fVar81 = auVar63._12_4_;
              auVar82._0_4_ = fVar61 * fVar2 + fVar3;
              auVar82._4_4_ = fVar76 * fVar2 + fVar3;
              auVar82._8_4_ = fVar79 * fVar2 + fVar3;
              auVar82._12_4_ = fVar81 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar26 + 0x160 + lVar28);
              fVar3 = *(float *)(uVar26 + 0xa0 + lVar28);
              auVar91._0_4_ = fVar61 * fVar2 + fVar3;
              auVar91._4_4_ = fVar76 * fVar2 + fVar3;
              auVar91._8_4_ = fVar79 * fVar2 + fVar3;
              auVar91._12_4_ = fVar81 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar26 + 0x1a0 + lVar28);
              fVar3 = *(float *)(uVar26 + 0xe0 + lVar28);
              auVar100._0_4_ = fVar61 * fVar2 + fVar3;
              auVar100._4_4_ = fVar76 * fVar2 + fVar3;
              auVar100._8_4_ = fVar79 * fVar2 + fVar3;
              auVar100._12_4_ = fVar81 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar26 + 0x140 + lVar28);
              fVar3 = *(float *)(uVar26 + 0x80 + lVar28);
              auVar114._0_4_ = fVar61 * fVar2 + fVar3;
              auVar114._4_4_ = fVar76 * fVar2 + fVar3;
              auVar114._8_4_ = fVar79 * fVar2 + fVar3;
              auVar114._12_4_ = fVar81 * fVar2 + fVar3;
              fVar2 = *(float *)(uVar26 + 0x180 + lVar28);
              fVar3 = *(float *)(uVar26 + 0xc0 + lVar28);
              auVar129._0_4_ = fVar3 + fVar61 * fVar2;
              auVar129._4_4_ = fVar3 + fVar76 * fVar2;
              auVar129._8_4_ = fVar3 + fVar79 * fVar2;
              auVar129._12_4_ = fVar3 + fVar81 * fVar2;
              fVar2 = *(float *)(uVar26 + 0x1c0 + lVar28);
              fVar3 = *(float *)(uVar26 + 0x100 + lVar28);
              auVar135._0_4_ = fVar2 * fVar61 + fVar3;
              auVar135._4_4_ = fVar2 * fVar76 + fVar3;
              auVar135._8_4_ = fVar2 * fVar79 + fVar3;
              auVar135._12_4_ = fVar2 * fVar81 + fVar3;
              auVar17._8_8_ = tray.org.field_0._8_8_;
              auVar17._0_8_ = tray.org.field_0._0_8_;
              auVar18._8_8_ = tray.org.field_0._24_8_;
              auVar18._0_8_ = tray.org.field_0._16_8_;
              auVar19._8_8_ = tray.org.field_0._40_8_;
              auVar19._0_8_ = tray.org.field_0._32_8_;
              auVar90 = vsubps_avx(auVar82,auVar17);
              auVar167._0_4_ = tray.rdir.field_0._0_4_ * auVar90._0_4_;
              auVar167._4_4_ = tray.rdir.field_0._4_4_ * auVar90._4_4_;
              auVar167._8_4_ = tray.rdir.field_0._8_4_ * auVar90._8_4_;
              auVar167._12_4_ = tray.rdir.field_0._12_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar91,auVar18);
              auVar177._0_4_ = auVar90._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar177._4_4_ = auVar90._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar177._8_4_ = auVar90._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar177._12_4_ = auVar90._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar90 = vsubps_avx(auVar100,auVar19);
              auVar184._0_4_ = auVar90._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar184._4_4_ = auVar90._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar184._8_4_ = auVar90._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar184._12_4_ = auVar90._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar90 = vsubps_avx(auVar114,auVar17);
              auVar115._0_4_ = tray.rdir.field_0._0_4_ * auVar90._0_4_;
              auVar115._4_4_ = tray.rdir.field_0._4_4_ * auVar90._4_4_;
              auVar115._8_4_ = tray.rdir.field_0._8_4_ * auVar90._8_4_;
              auVar115._12_4_ = tray.rdir.field_0._12_4_ * auVar90._12_4_;
              auVar90 = vsubps_avx(auVar129,auVar18);
              auVar92._0_4_ = auVar90._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar92._4_4_ = auVar90._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar92._8_4_ = auVar90._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar92._12_4_ = auVar90._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar90 = vsubps_avx(auVar135,auVar19);
              auVar101._0_4_ = auVar90._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar101._4_4_ = auVar90._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar101._8_4_ = auVar90._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar101._12_4_ = auVar90._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar90 = vpminsd_avx(auVar167,auVar115);
              auVar51 = vpminsd_avx(auVar177,auVar92);
              auVar90 = vpmaxsd_avx(auVar90,auVar51);
              auVar51 = vpminsd_avx(auVar184,auVar101);
              auVar90 = vpmaxsd_avx(auVar90,auVar51);
              auVar83._0_4_ = auVar90._0_4_ * 0.99999964;
              auVar83._4_4_ = auVar90._4_4_ * 0.99999964;
              auVar83._8_4_ = auVar90._8_4_ * 0.99999964;
              auVar83._12_4_ = auVar90._12_4_ * 0.99999964;
              auVar90 = vpmaxsd_avx(auVar167,auVar115);
              auVar51 = vpmaxsd_avx(auVar177,auVar92);
              auVar51 = vpminsd_avx(auVar90,auVar51);
              auVar90 = vpmaxsd_avx(auVar184,auVar101);
              auVar51 = vpminsd_avx(auVar51,auVar90);
              auVar90 = vpmaxsd_avx(auVar83,(undefined1  [16])tray.tnear.field_0);
              auVar102._0_4_ = auVar51._0_4_ * 1.0000004;
              auVar102._4_4_ = auVar51._4_4_ * 1.0000004;
              auVar102._8_4_ = auVar51._8_4_ * 1.0000004;
              auVar102._12_4_ = auVar51._12_4_ * 1.0000004;
              auVar51 = vpminsd_avx(auVar102,(undefined1  [16])tray.tfar.field_0);
              if ((uVar24 & 7) == 6) {
                auVar90 = vcmpps_avx(auVar90,auVar51,2);
                uVar27 = *(undefined4 *)(uVar26 + 0x1e0 + lVar28);
                auVar103._4_4_ = uVar27;
                auVar103._0_4_ = uVar27;
                auVar103._8_4_ = uVar27;
                auVar103._12_4_ = uVar27;
                auVar51 = vcmpps_avx(auVar103,auVar63,2);
                uVar27 = *(undefined4 *)(uVar26 + 0x200 + lVar28);
                auVar116._4_4_ = uVar27;
                auVar116._0_4_ = uVar27;
                auVar116._8_4_ = uVar27;
                auVar116._12_4_ = uVar27;
                auVar63 = vcmpps_avx(auVar63,auVar116,1);
                auVar63 = vandps_avx(auVar51,auVar63);
                auVar63 = vandps_avx(auVar63,auVar90);
              }
              else {
                auVar63 = vcmpps_avx(auVar90,auVar51,2);
              }
              auVar63 = vandps_avx(auVar63,auVar41);
              auVar63 = vpslld_avx(auVar63,0x1f);
              if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar63[0xf]) {
                auVar75 = ZEXT1664(auVar43);
                root.ptr = sVar30;
              }
              else {
                auVar93._8_4_ = 0x7f800000;
                auVar93._0_8_ = 0x7f8000007f800000;
                auVar93._12_4_ = 0x7f800000;
                auVar63 = vblendvps_avx(auVar93,auVar83,auVar63);
                auVar75 = ZEXT1664(auVar63);
                if (sVar30 != 8) {
                  pNVar33->ptr = sVar30;
                  pNVar33 = pNVar33 + 1;
                  *(undefined1 (*) [16])paVar34->v = auVar43;
                  paVar34 = paVar34 + 1;
                }
              }
              auVar43 = auVar75._0_16_;
              lVar28 = lVar28 + 4;
              sVar30 = root.ptr;
            } while (lVar28 != 0);
            iVar25 = 4;
            if (root.ptr == 8) {
              auVar41 = vpcmpeqd_avx(auVar43,auVar43);
              auVar55 = ZEXT1664(auVar41);
              goto LAB_0153d206;
            }
            auVar41 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                 (undefined1  [16])auVar75._0_16_,6);
            uVar27 = vmovmskps_avx(auVar41);
            auVar41 = vpcmpeqd_avx(auVar43,auVar43);
            auVar55 = ZEXT1664(auVar41);
          } while ((byte)uVar31 < (byte)POPCOUNT(uVar27));
          pNVar33->ptr = root.ptr;
          pNVar33 = pNVar33 + 1;
          *paVar34 = auVar75._0_16_;
          paVar34 = paVar34 + 1;
        }
        else {
          do {
            sVar30 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> sVar30 & 1) == 0; sVar30 = sVar30 + 1) {
              }
            }
            auVar55 = ZEXT1664(auVar55._0_16_);
            bVar35 = occluded1(local_37a0,local_37a8,root,sVar30,&pre,ray,&tray,context);
            if (bVar35) {
              terminated.field_0.i[sVar30] = -1;
            }
            uVar26 = uVar26 & uVar26 - 1;
          } while (uVar26 != 0);
          auVar41 = vpcmpeqd_avx(auVar55._0_16_,auVar55._0_16_);
          auVar63 = auVar41 & ~(undefined1  [16])terminated.field_0;
          if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar63[0xf]) {
            iVar25 = 3;
          }
          else {
            auVar41._8_4_ = 0xff800000;
            auVar41._0_8_ = 0xff800000ff800000;
            auVar41._12_4_ = 0xff800000;
            aVar10.v = (__m128)vblendvps_avx(tray.tfar.field_0,auVar41,
                                             (undefined1  [16])terminated.field_0);
            auVar41 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,
                                   (undefined1  [16])tray.tfar.field_0);
            iVar25 = 2;
            tray.tfar.field_0 = aVar10;
          }
          auVar55 = ZEXT1664(auVar41);
          auVar75 = ZEXT1664((undefined1  [16])vVar5.field_0);
          if (uVar31 < uVar24) goto LAB_0153c671;
        }
LAB_0153d206:
      } while ((iVar25 == 4) || (iVar25 == 2));
LAB_0153d326:
      auVar11 = vandps_avx(auVar11,(undefined1  [16])terminated.field_0);
      auVar54._8_4_ = 0xff800000;
      auVar54._0_8_ = 0xff800000ff800000;
      auVar54._12_4_ = 0xff800000;
      auVar11 = vmaskmovps_avx(auVar11,auVar54);
      *(undefined1 (*) [16])pRVar1 = auVar11;
    }
  }
  return;
  while( true ) {
    uVar32 = uVar32 + 1;
    lVar28 = lVar28 + 0x140;
    auVar63 = auVar51;
    if (uVar26 - 8 <= uVar32) break;
LAB_0153c95c:
    uVar29 = 0;
    auVar90 = auVar63;
    while( true ) {
      uVar24 = *(uint *)(lVar28 + -0x10 + uVar29 * 4);
      if ((ulong)uVar24 == 0xffffffff) break;
      fVar8 = *(float *)(ray + 0x70);
      fVar9 = *(float *)(ray + 0x74);
      fVar42 = *(float *)(ray + 0x78);
      fVar109 = *(float *)(ray + 0x7c);
      fVar2 = *(float *)(lVar28 + -0xa0 + uVar29 * 4);
      fVar3 = *(float *)(lVar28 + -0x90 + uVar29 * 4);
      fVar61 = *(float *)(lVar28 + -0x80 + uVar29 * 4);
      fVar76 = *(float *)(lVar28 + -0x130 + uVar29 * 4);
      fVar79 = *(float *)(lVar28 + -0x120 + uVar29 * 4);
      fVar81 = *(float *)(lVar28 + -0x110 + uVar29 * 4);
      auVar44._0_4_ = fVar8 * fVar2 + fVar76;
      auVar44._4_4_ = fVar9 * fVar2 + fVar76;
      auVar44._8_4_ = fVar42 * fVar2 + fVar76;
      auVar44._12_4_ = fVar109 * fVar2 + fVar76;
      auVar64._0_4_ = fVar8 * fVar3 + fVar79;
      auVar64._4_4_ = fVar9 * fVar3 + fVar79;
      auVar64._8_4_ = fVar42 * fVar3 + fVar79;
      auVar64._12_4_ = fVar109 * fVar3 + fVar79;
      auVar84._0_4_ = fVar8 * fVar61 + fVar81;
      auVar84._4_4_ = fVar9 * fVar61 + fVar81;
      auVar84._8_4_ = fVar42 * fVar61 + fVar81;
      auVar84._12_4_ = fVar109 * fVar61 + fVar81;
      fVar2 = *(float *)(lVar28 + -0x70 + uVar29 * 4);
      fVar3 = *(float *)(lVar28 + -0x60 + uVar29 * 4);
      fVar61 = *(float *)(lVar28 + -0x50 + uVar29 * 4);
      fVar76 = *(float *)(lVar28 + -0x100 + uVar29 * 4);
      fVar79 = *(float *)(lVar28 + -0xf0 + uVar29 * 4);
      fVar81 = *(float *)(lVar28 + -0xe0 + uVar29 * 4);
      auVar94._0_4_ = fVar8 * fVar2 + fVar76;
      auVar94._4_4_ = fVar9 * fVar2 + fVar76;
      auVar94._8_4_ = fVar42 * fVar2 + fVar76;
      auVar94._12_4_ = fVar109 * fVar2 + fVar76;
      auVar104._0_4_ = fVar79 + fVar8 * fVar3;
      auVar104._4_4_ = fVar79 + fVar9 * fVar3;
      auVar104._8_4_ = fVar79 + fVar42 * fVar3;
      auVar104._12_4_ = fVar79 + fVar109 * fVar3;
      auVar117._0_4_ = fVar81 + fVar8 * fVar61;
      auVar117._4_4_ = fVar81 + fVar9 * fVar61;
      auVar117._8_4_ = fVar81 + fVar42 * fVar61;
      auVar117._12_4_ = fVar81 + fVar109 * fVar61;
      fVar2 = *(float *)(lVar28 + -0x40 + uVar29 * 4);
      fVar3 = *(float *)(lVar28 + -0x30 + uVar29 * 4);
      fVar61 = *(float *)(lVar28 + -0x20 + uVar29 * 4);
      fVar76 = *(float *)(lVar28 + -0xd0 + uVar29 * 4);
      fVar79 = *(float *)(lVar28 + -0xc0 + uVar29 * 4);
      fVar81 = *(float *)(lVar28 + -0xb0 + uVar29 * 4);
      auVar168._0_4_ = fVar76 + fVar8 * fVar2;
      auVar168._4_4_ = fVar76 + fVar9 * fVar2;
      auVar168._8_4_ = fVar76 + fVar42 * fVar2;
      auVar168._12_4_ = fVar76 + fVar109 * fVar2;
      auVar136._0_4_ = fVar3 * fVar8 + fVar79;
      auVar136._4_4_ = fVar3 * fVar9 + fVar79;
      auVar136._8_4_ = fVar3 * fVar42 + fVar79;
      auVar136._12_4_ = fVar3 * fVar109 + fVar79;
      auVar150._0_4_ = fVar81 + fVar61 * fVar8;
      auVar150._4_4_ = fVar81 + fVar61 * fVar9;
      auVar150._8_4_ = fVar81 + fVar61 * fVar42;
      auVar150._12_4_ = fVar81 + fVar61 * fVar109;
      auVar41 = *(undefined1 (*) [16])ray;
      auVar51 = *(undefined1 (*) [16])(ray + 0x10);
      auVar53 = *(undefined1 (*) [16])(ray + 0x20);
      auVar99 = vsubps_avx(auVar44,auVar41);
      auVar112 = vsubps_avx(auVar64,auVar51);
      auVar113 = vsubps_avx(auVar84,auVar53);
      auVar134 = vsubps_avx(auVar94,auVar41);
      auVar148 = vsubps_avx(auVar104,auVar51);
      auVar149 = vsubps_avx(auVar117,auVar53);
      auVar41 = vsubps_avx(auVar168,auVar41);
      auVar51 = vsubps_avx(auVar136,auVar51);
      auVar53 = vsubps_avx(auVar150,auVar53);
      auVar164 = vsubps_avx(auVar41,auVar99);
      auVar14 = vsubps_avx(auVar51,auVar112);
      auVar36 = vsubps_avx(auVar53,auVar113);
      fVar2 = auVar112._0_4_;
      fVar109 = auVar51._0_4_ + fVar2;
      fVar61 = auVar112._4_4_;
      fVar120 = auVar51._4_4_ + fVar61;
      fVar79 = auVar112._8_4_;
      fVar123 = auVar51._8_4_ + fVar79;
      fVar8 = auVar112._12_4_;
      fVar126 = auVar51._12_4_ + fVar8;
      fVar181 = auVar113._0_4_;
      fVar132 = fVar181 + auVar53._0_4_;
      fVar186 = auVar113._4_4_;
      fVar140 = fVar186 + auVar53._4_4_;
      fVar188 = auVar113._8_4_;
      fVar142 = fVar188 + auVar53._8_4_;
      fVar190 = auVar113._12_4_;
      fVar144 = fVar190 + auVar53._12_4_;
      fVar42 = auVar36._0_4_;
      auVar151._0_4_ = fVar109 * fVar42;
      fVar58 = auVar36._4_4_;
      auVar151._4_4_ = fVar120 * fVar58;
      fVar12 = auVar36._8_4_;
      auVar151._8_4_ = fVar123 * fVar12;
      fVar13 = auVar36._12_4_;
      auVar151._12_4_ = fVar126 * fVar13;
      fVar176 = auVar14._0_4_;
      auVar159._0_4_ = fVar176 * fVar132;
      fVar178 = auVar14._4_4_;
      auVar159._4_4_ = fVar178 * fVar140;
      fVar179 = auVar14._8_4_;
      auVar159._8_4_ = fVar179 * fVar142;
      fVar180 = auVar14._12_4_;
      auVar159._12_4_ = fVar180 * fVar144;
      auVar14 = vsubps_avx(auVar159,auVar151);
      fVar3 = auVar99._0_4_;
      fVar146 = auVar41._0_4_ + fVar3;
      fVar76 = auVar99._4_4_;
      fVar154 = auVar41._4_4_ + fVar76;
      fVar81 = auVar99._8_4_;
      fVar156 = auVar41._8_4_ + fVar81;
      fVar9 = auVar99._12_4_;
      fVar157 = auVar41._12_4_ + fVar9;
      fVar165 = auVar164._0_4_;
      auVar137._0_4_ = fVar165 * fVar132;
      fVar170 = auVar164._4_4_;
      auVar137._4_4_ = fVar170 * fVar140;
      fVar172 = auVar164._8_4_;
      auVar137._8_4_ = fVar172 * fVar142;
      fVar174 = auVar164._12_4_;
      auVar137._12_4_ = fVar174 * fVar144;
      auVar160._0_4_ = fVar146 * fVar42;
      auVar160._4_4_ = fVar154 * fVar58;
      auVar160._8_4_ = fVar156 * fVar12;
      auVar160._12_4_ = fVar157 * fVar13;
      auVar164 = vsubps_avx(auVar160,auVar137);
      auVar138._0_4_ = fVar146 * fVar176;
      auVar138._4_4_ = fVar154 * fVar178;
      auVar138._8_4_ = fVar156 * fVar179;
      auVar138._12_4_ = fVar157 * fVar180;
      auVar118._0_4_ = fVar165 * fVar109;
      auVar118._4_4_ = fVar170 * fVar120;
      auVar118._8_4_ = fVar172 * fVar123;
      auVar118._12_4_ = fVar174 * fVar126;
      auVar36 = vsubps_avx(auVar118,auVar138);
      fVar132 = *(float *)(ray + 0x60);
      fVar140 = *(float *)(ray + 100);
      fVar142 = *(float *)(ray + 0x68);
      auVar21 = *(undefined1 (*) [12])(ray + 0x60);
      fVar144 = *(float *)(ray + 0x6c);
      fVar146 = *(float *)(ray + 0x50);
      fVar154 = *(float *)(ray + 0x54);
      fVar156 = *(float *)(ray + 0x58);
      auVar22 = *(undefined1 (*) [12])(ray + 0x50);
      fVar157 = *(float *)(ray + 0x5c);
      auVar20 = *(undefined1 (*) [12])(ray + 0x40);
      fVar16 = *(float *)(ray + 0x4c);
      fVar147 = auVar14._0_4_ * *(float *)(ray + 0x40) +
                fVar146 * auVar164._0_4_ + auVar36._0_4_ * fVar132;
      fVar155 = auVar14._4_4_ * *(float *)(ray + 0x44) +
                fVar154 * auVar164._4_4_ + auVar36._4_4_ * fVar140;
      auVar152._0_8_ = CONCAT44(fVar155,fVar147);
      auVar152._8_4_ =
           auVar14._8_4_ * *(float *)(ray + 0x48) +
           fVar156 * auVar164._8_4_ + auVar36._8_4_ * fVar142;
      auVar152._12_4_ =
           auVar14._12_4_ * fVar16 + fVar157 * auVar164._12_4_ + auVar36._12_4_ * fVar144;
      auVar112 = vsubps_avx(auVar112,auVar148);
      auVar113 = vsubps_avx(auVar113,auVar149);
      fVar110 = fVar2 + auVar148._0_4_;
      fVar121 = fVar61 + auVar148._4_4_;
      fVar124 = fVar79 + auVar148._8_4_;
      fVar127 = fVar8 + auVar148._12_4_;
      fVar182 = fVar181 + auVar149._0_4_;
      fVar187 = fVar186 + auVar149._4_4_;
      fVar189 = fVar188 + auVar149._8_4_;
      fVar191 = fVar190 + auVar149._12_4_;
      fVar158 = auVar113._0_4_;
      auVar169._0_4_ = fVar158 * fVar110;
      fVar161 = auVar113._4_4_;
      auVar169._4_4_ = fVar161 * fVar121;
      fVar162 = auVar113._8_4_;
      auVar169._8_4_ = fVar162 * fVar124;
      fVar163 = auVar113._12_4_;
      auVar169._12_4_ = fVar163 * fVar127;
      fVar109 = auVar112._0_4_;
      auVar65._0_4_ = fVar182 * fVar109;
      fVar120 = auVar112._4_4_;
      auVar65._4_4_ = fVar187 * fVar120;
      fVar123 = auVar112._8_4_;
      auVar65._8_4_ = fVar189 * fVar123;
      fVar126 = auVar112._12_4_;
      auVar65._12_4_ = fVar191 * fVar126;
      auVar112 = vsubps_avx(auVar65,auVar169);
      auVar99 = vsubps_avx(auVar99,auVar134);
      fVar166 = auVar99._0_4_;
      auVar185._0_4_ = fVar166 * fVar182;
      fVar171 = auVar99._4_4_;
      auVar185._4_4_ = fVar171 * fVar187;
      fVar173 = auVar99._8_4_;
      auVar185._8_4_ = fVar173 * fVar189;
      fVar175 = auVar99._12_4_;
      auVar185._12_4_ = fVar175 * fVar191;
      fVar182 = fVar3 + auVar134._0_4_;
      fVar187 = fVar76 + auVar134._4_4_;
      fVar189 = fVar81 + auVar134._8_4_;
      fVar191 = fVar9 + auVar134._12_4_;
      auVar139._0_4_ = fVar158 * fVar182;
      auVar139._4_4_ = fVar161 * fVar187;
      auVar139._8_4_ = fVar162 * fVar189;
      auVar139._12_4_ = fVar163 * fVar191;
      auVar99 = vsubps_avx(auVar139,auVar185);
      auVar130._0_4_ = fVar182 * fVar109;
      auVar130._4_4_ = fVar187 * fVar120;
      auVar130._8_4_ = fVar189 * fVar123;
      auVar130._12_4_ = fVar191 * fVar126;
      auVar119._0_4_ = fVar166 * fVar110;
      auVar119._4_4_ = fVar171 * fVar121;
      auVar119._8_4_ = fVar173 * fVar124;
      auVar119._12_4_ = fVar175 * fVar127;
      auVar113 = vsubps_avx(auVar119,auVar130);
      local_3838 = auVar20._0_4_;
      fStack_3834 = auVar20._4_4_;
      fStack_3830 = auVar20._8_4_;
      fVar182 = local_3838 * auVar112._0_4_ + auVar113._0_4_ * fVar132 + fVar146 * auVar99._0_4_;
      fVar189 = fStack_3834 * auVar112._4_4_ + auVar113._4_4_ * fVar140 + fVar154 * auVar99._4_4_;
      fVar56 = fStack_3830 * auVar112._8_4_ + auVar113._8_4_ * fVar142 + fVar156 * auVar99._8_4_;
      fVar59 = fVar16 * auVar112._12_4_ + auVar113._12_4_ * fVar144 + fVar157 * auVar99._12_4_;
      auVar99 = vsubps_avx(auVar134,auVar41);
      fVar187 = auVar134._0_4_ + auVar41._0_4_;
      fVar191 = auVar134._4_4_ + auVar41._4_4_;
      fVar57 = auVar134._8_4_ + auVar41._8_4_;
      fVar60 = auVar134._12_4_ + auVar41._12_4_;
      auVar41 = vsubps_avx(auVar148,auVar51);
      fVar110 = auVar51._0_4_ + auVar148._0_4_;
      fVar121 = auVar51._4_4_ + auVar148._4_4_;
      fVar124 = auVar51._8_4_ + auVar148._8_4_;
      fVar127 = auVar51._12_4_ + auVar148._12_4_;
      auVar51 = vsubps_avx(auVar149,auVar53);
      fVar62 = auVar149._0_4_ + auVar53._0_4_;
      fVar77 = auVar149._4_4_ + auVar53._4_4_;
      fVar78 = auVar149._8_4_ + auVar53._8_4_;
      fVar80 = auVar149._12_4_ + auVar53._12_4_;
      fVar133 = auVar51._0_4_;
      auVar85._0_4_ = fVar133 * fVar110;
      fVar141 = auVar51._4_4_;
      auVar85._4_4_ = fVar141 * fVar121;
      fVar143 = auVar51._8_4_;
      auVar85._8_4_ = fVar143 * fVar124;
      fVar145 = auVar51._12_4_;
      auVar85._12_4_ = fVar145 * fVar127;
      fVar111 = auVar41._0_4_;
      auVar105._0_4_ = fVar111 * fVar62;
      fVar122 = auVar41._4_4_;
      auVar105._4_4_ = fVar122 * fVar77;
      fVar125 = auVar41._8_4_;
      auVar105._8_4_ = fVar125 * fVar78;
      fVar128 = auVar41._12_4_;
      auVar105._12_4_ = fVar128 * fVar80;
      auVar41 = vsubps_avx(auVar105,auVar85);
      fVar183 = auVar99._0_4_;
      auVar66._0_4_ = fVar183 * fVar62;
      fVar62 = auVar99._4_4_;
      auVar66._4_4_ = fVar62 * fVar77;
      fVar77 = auVar99._8_4_;
      auVar66._8_4_ = fVar77 * fVar78;
      fVar78 = auVar99._12_4_;
      auVar66._12_4_ = fVar78 * fVar80;
      auVar106._0_4_ = fVar133 * fVar187;
      auVar106._4_4_ = fVar141 * fVar191;
      auVar106._8_4_ = fVar143 * fVar57;
      auVar106._12_4_ = fVar145 * fVar60;
      auVar51 = vsubps_avx(auVar106,auVar66);
      auVar45._0_4_ = fVar187 * fVar111;
      auVar45._4_4_ = fVar191 * fVar122;
      auVar45._8_4_ = fVar57 * fVar125;
      auVar45._12_4_ = fVar60 * fVar128;
      auVar36._0_4_ = fVar183 * fVar110;
      auVar36._4_4_ = fVar62 * fVar121;
      auVar36._8_4_ = fVar77 * fVar124;
      auVar36._12_4_ = fVar78 * fVar127;
      auVar53 = vsubps_avx(auVar36,auVar45);
      auVar95._8_4_ = 0x7fffffff;
      auVar95._0_8_ = 0x7fffffff7fffffff;
      auVar95._12_4_ = 0x7fffffff;
      auVar14._4_4_ = fVar189;
      auVar14._0_4_ = fVar182;
      auVar14._8_4_ = fVar56;
      auVar14._12_4_ = fVar59;
      auVar37._0_4_ = local_3838 * auVar41._0_4_ + auVar53._0_4_ * fVar132 + fVar146 * auVar51._0_4_
      ;
      auVar37._4_4_ =
           fStack_3834 * auVar41._4_4_ + auVar53._4_4_ * fVar140 + fVar154 * auVar51._4_4_;
      auVar37._8_4_ =
           fStack_3830 * auVar41._8_4_ + auVar53._8_4_ * fVar142 + fVar156 * auVar51._8_4_;
      auVar37._12_4_ = fVar16 * auVar41._12_4_ + auVar53._12_4_ * fVar144 + fVar157 * auVar51._12_4_
      ;
      auVar107._0_4_ = auVar37._0_4_ + fVar147 + fVar182;
      auVar107._4_4_ = auVar37._4_4_ + fVar155 + fVar189;
      auVar107._8_4_ = auVar37._8_4_ + auVar152._8_4_ + fVar56;
      auVar107._12_4_ = auVar37._12_4_ + auVar152._12_4_ + fVar59;
      auVar41 = vandps_avx(auVar107,auVar95);
      auVar46._0_4_ = auVar41._0_4_ * 1.1920929e-07;
      auVar46._4_4_ = auVar41._4_4_ * 1.1920929e-07;
      auVar46._8_4_ = auVar41._8_4_ * 1.1920929e-07;
      auVar46._12_4_ = auVar41._12_4_ * 1.1920929e-07;
      auVar41 = vminps_avx(auVar152,auVar14);
      auVar41 = vminps_avx(auVar41,auVar37);
      uVar15 = CONCAT44(auVar46._4_4_,auVar46._0_4_);
      auVar86._0_8_ = uVar15 ^ 0x8000000080000000;
      auVar86._8_4_ = -auVar46._8_4_;
      auVar86._12_4_ = -auVar46._12_4_;
      auVar41 = vcmpps_avx(auVar41,auVar86,5);
      auVar51 = vmaxps_avx(auVar152,auVar14);
      auVar51 = vmaxps_avx(auVar51,auVar37);
      auVar51 = vcmpps_avx(auVar51,auVar46,2);
      auVar41 = vorps_avx(auVar41,auVar51);
      auVar53 = auVar90 & auVar41;
      auVar41 = vandps_avx(auVar41,auVar90);
      auVar51 = auVar90;
      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar53[0xf] < '\0'
         ) {
        auVar38._0_4_ = fVar109 * fVar42;
        auVar38._4_4_ = fVar120 * fVar58;
        auVar38._8_4_ = fVar123 * fVar12;
        auVar38._12_4_ = fVar126 * fVar13;
        auVar47._0_4_ = fVar158 * fVar176;
        auVar47._4_4_ = fVar161 * fVar178;
        auVar47._8_4_ = fVar162 * fVar179;
        auVar47._12_4_ = fVar163 * fVar180;
        auVar99 = vsubps_avx(auVar47,auVar38);
        auVar67._0_4_ = fVar158 * fVar111;
        auVar67._4_4_ = fVar161 * fVar122;
        auVar67._8_4_ = fVar162 * fVar125;
        auVar67._12_4_ = fVar163 * fVar128;
        auVar87._0_4_ = fVar109 * fVar133;
        auVar87._4_4_ = fVar120 * fVar141;
        auVar87._8_4_ = fVar123 * fVar143;
        auVar87._12_4_ = fVar126 * fVar145;
        auVar112 = vsubps_avx(auVar87,auVar67);
        auVar51 = vandps_avx(auVar38,auVar95);
        auVar53 = vandps_avx(auVar67,auVar95);
        auVar51 = vcmpps_avx(auVar51,auVar53,1);
        auVar99 = vblendvps_avx(auVar112,auVar99,auVar51);
        auVar39._0_4_ = fVar166 * fVar133;
        auVar39._4_4_ = fVar171 * fVar141;
        auVar39._8_4_ = fVar173 * fVar143;
        auVar39._12_4_ = fVar175 * fVar145;
        auVar48._0_4_ = fVar166 * fVar42;
        auVar48._4_4_ = fVar171 * fVar58;
        auVar48._8_4_ = fVar173 * fVar12;
        auVar48._12_4_ = fVar175 * fVar13;
        auVar68._0_4_ = fVar158 * fVar165;
        auVar68._4_4_ = fVar161 * fVar170;
        auVar68._8_4_ = fVar162 * fVar172;
        auVar68._12_4_ = fVar163 * fVar174;
        auVar112 = vsubps_avx(auVar48,auVar68);
        auVar96._0_4_ = fVar183 * fVar158;
        auVar96._4_4_ = fVar62 * fVar161;
        auVar96._8_4_ = fVar77 * fVar162;
        auVar96._12_4_ = fVar78 * fVar163;
        auVar113 = vsubps_avx(auVar96,auVar39);
        auVar51 = vandps_avx(auVar95,auVar68);
        auVar53 = vandps_avx(auVar95,auVar39);
        auVar51 = vcmpps_avx(auVar51,auVar53,1);
        auVar112 = vblendvps_avx(auVar113,auVar112,auVar51);
        auVar49._0_4_ = fVar183 * fVar109;
        auVar49._4_4_ = fVar62 * fVar120;
        auVar49._8_4_ = fVar77 * fVar123;
        auVar49._12_4_ = fVar78 * fVar126;
        auVar69._0_4_ = fVar109 * fVar165;
        auVar69._4_4_ = fVar120 * fVar170;
        auVar69._8_4_ = fVar123 * fVar172;
        auVar69._12_4_ = fVar126 * fVar174;
        auVar97._0_4_ = fVar166 * fVar176;
        auVar97._4_4_ = fVar171 * fVar178;
        auVar97._8_4_ = fVar173 * fVar179;
        auVar97._12_4_ = fVar175 * fVar180;
        auVar108._0_4_ = fVar166 * fVar111;
        auVar108._4_4_ = fVar171 * fVar122;
        auVar108._8_4_ = fVar173 * fVar125;
        auVar108._12_4_ = fVar175 * fVar128;
        auVar113 = vsubps_avx(auVar69,auVar97);
        auVar134 = vsubps_avx(auVar108,auVar49);
        auVar51 = vandps_avx(auVar95,auVar97);
        auVar53 = vandps_avx(auVar95,auVar49);
        auVar51 = vcmpps_avx(auVar51,auVar53,1);
        auVar53 = vblendvps_avx(auVar134,auVar113,auVar51);
        local_3808 = auVar21._0_4_;
        fStack_3804 = auVar21._4_4_;
        fStack_3800 = auVar21._8_4_;
        local_37c8 = auVar22._0_4_;
        fStack_37c4 = auVar22._4_4_;
        fStack_37c0 = auVar22._8_4_;
        fVar42 = auVar99._0_4_ * local_3838 +
                 auVar53._0_4_ * local_3808 + auVar112._0_4_ * local_37c8;
        fVar109 = auVar99._4_4_ * fStack_3834 +
                  auVar53._4_4_ * fStack_3804 + auVar112._4_4_ * fStack_37c4;
        fVar58 = auVar99._8_4_ * fStack_3830 +
                 auVar53._8_4_ * fStack_3800 + auVar112._8_4_ * fStack_37c0;
        fVar120 = auVar99._12_4_ * fVar16 + auVar53._12_4_ * fVar144 + auVar112._12_4_ * fVar157;
        auVar50._0_4_ = fVar42 + fVar42;
        auVar50._4_4_ = fVar109 + fVar109;
        auVar50._8_4_ = fVar58 + fVar58;
        auVar50._12_4_ = fVar120 + fVar120;
        fVar42 = auVar99._0_4_ * fVar3 + auVar53._0_4_ * fVar181 + auVar112._0_4_ * fVar2;
        fVar109 = auVar99._4_4_ * fVar76 + auVar53._4_4_ * fVar186 + auVar112._4_4_ * fVar61;
        fVar79 = auVar99._8_4_ * fVar81 + auVar53._8_4_ * fVar188 + auVar112._8_4_ * fVar79;
        fVar81 = auVar99._12_4_ * fVar9 + auVar53._12_4_ * fVar190 + auVar112._12_4_ * fVar8;
        auVar51 = vrcpps_avx(auVar50);
        fVar2 = auVar51._0_4_;
        auVar131._0_4_ = auVar50._0_4_ * fVar2;
        fVar3 = auVar51._4_4_;
        auVar131._4_4_ = auVar50._4_4_ * fVar3;
        fVar61 = auVar51._8_4_;
        auVar131._8_4_ = auVar50._8_4_ * fVar61;
        fVar76 = auVar51._12_4_;
        auVar131._12_4_ = auVar50._12_4_ * fVar76;
        auVar153._8_4_ = 0x3f800000;
        auVar153._0_8_ = 0x3f8000003f800000;
        auVar153._12_4_ = 0x3f800000;
        auVar51 = vsubps_avx(auVar153,auVar131);
        auVar70._0_4_ = (fVar42 + fVar42) * (fVar2 + fVar2 * auVar51._0_4_);
        auVar70._4_4_ = (fVar109 + fVar109) * (fVar3 + fVar3 * auVar51._4_4_);
        auVar70._8_4_ = (fVar79 + fVar79) * (fVar61 + fVar61 * auVar51._8_4_);
        auVar70._12_4_ = (fVar81 + fVar81) * (fVar76 + fVar76 * auVar51._12_4_);
        auVar51 = vcmpps_avx(auVar70,*(undefined1 (*) [16])(ray + 0x80),2);
        auVar113 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar70,2);
        auVar51 = vandps_avx(auVar113,auVar51);
        auVar113 = vcmpps_avx(auVar50,_DAT_01f7aa10,4);
        auVar51 = vandps_avx(auVar113,auVar51);
        auVar51 = vpslld_avx(auVar51,0x1f);
        auVar51 = vpsrad_avx(auVar51,0x1f);
        auVar113 = auVar41 & auVar51;
        auVar41 = vandps_avx(auVar41,auVar51);
        if ((((auVar113 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar113 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar113 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar113[0xf] < '\0') {
          uStack_37d0 = auVar152._8_8_;
          uStack_3600 = uStack_37d0;
          local_3668 = auVar53;
          local_3658 = auVar112;
          local_3648 = auVar99;
          local_3638 = auVar70;
          local_3628 = auVar107;
          _local_3618 = auVar14;
          local_3608 = auVar152._0_8_;
        }
      }
      pGVar6 = (context->scene->geometries).items[uVar24].ptr;
      uVar4 = pGVar6->mask;
      auVar40._4_4_ = uVar4;
      auVar40._0_4_ = uVar4;
      auVar40._8_4_ = uVar4;
      auVar40._12_4_ = uVar4;
      auVar53 = vandps_avx(auVar40,*(undefined1 (*) [16])(ray + 0x90));
      auVar53 = vpcmpeqd_avx(auVar53,_DAT_01f7aa10);
      auVar99 = auVar41 & ~auVar53;
      if ((((auVar99 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar99 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar99 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar99[0xf])
      {
        auVar41 = vpcmpeqd_avx(auVar51,auVar51);
      }
      else {
        auVar41 = vandnps_avx(auVar53,auVar41);
        if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
           (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
          auVar51 = vandps_avx(local_3628,auVar95);
          auVar53 = vrcpps_avx(local_3628);
          fVar2 = auVar53._0_4_;
          auVar88._0_4_ = local_3628._0_4_ * fVar2;
          fVar3 = auVar53._4_4_;
          auVar88._4_4_ = local_3628._4_4_ * fVar3;
          fVar61 = auVar53._8_4_;
          auVar88._8_4_ = local_3628._8_4_ * fVar61;
          fVar76 = auVar53._12_4_;
          auVar88._12_4_ = local_3628._12_4_ * fVar76;
          auVar98._8_4_ = 0x3f800000;
          auVar98._0_8_ = 0x3f8000003f800000;
          auVar98._12_4_ = 0x3f800000;
          auVar53 = vsubps_avx(auVar98,auVar88);
          auVar71._0_4_ = fVar2 + fVar2 * auVar53._0_4_;
          auVar71._4_4_ = fVar3 + fVar3 * auVar53._4_4_;
          auVar71._8_4_ = fVar61 + fVar61 * auVar53._8_4_;
          auVar71._12_4_ = fVar76 + fVar76 * auVar53._12_4_;
          auVar89._8_4_ = 0x219392ef;
          auVar89._0_8_ = 0x219392ef219392ef;
          auVar89._12_4_ = 0x219392ef;
          auVar51 = vcmpps_avx(auVar51,auVar89,5);
          auVar51 = vandps_avx(auVar51,auVar71);
          auVar72._0_4_ = auVar51._0_4_ * (float)local_3608;
          auVar72._4_4_ = auVar51._4_4_ * local_3608._4_4_;
          auVar72._8_4_ = auVar51._8_4_ * (float)uStack_3600;
          auVar72._12_4_ = auVar51._12_4_ * uStack_3600._4_4_;
          local_3538 = vminps_avx(auVar72,auVar98);
          auVar52._0_4_ = auVar51._0_4_ * (float)local_3618._0_4_;
          auVar52._4_4_ = auVar51._4_4_ * (float)local_3618._4_4_;
          auVar52._8_4_ = auVar51._8_4_ * fStack_3610;
          auVar52._12_4_ = auVar51._12_4_ * fStack_360c;
          local_3528 = vminps_avx(auVar52,auVar98);
          local_3508 = vpshufd_avx(ZEXT416(uVar24),0);
          local_3518 = vpshufd_avx(ZEXT416(*(uint *)(lVar28 + uVar29 * 4)),0);
          local_3568 = local_3648._0_8_;
          uStack_3560 = local_3648._8_8_;
          local_3558 = local_3658._0_8_;
          uStack_3550 = local_3658._8_8_;
          local_3548 = local_3668;
          vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          uStack_34f4 = context->user->instID[0];
          local_34f8 = uStack_34f4;
          uStack_34f0 = uStack_34f4;
          uStack_34ec = uStack_34f4;
          uStack_34e8 = context->user->instPrimID[0];
          uStack_34e4 = uStack_34e8;
          uStack_34e0 = uStack_34e8;
          uStack_34dc = uStack_34e8;
          auVar51 = *(undefined1 (*) [16])(ray + 0x80);
          auVar53 = vblendvps_avx(auVar51,local_3638,auVar41);
          *(undefined1 (*) [16])(ray + 0x80) = auVar53;
          args.valid = (int *)local_37b8;
          args.geometryUserPtr = pGVar6->userPtr;
          args.context = context->user;
          args.hit = (RTCHitN *)&local_3568;
          args.N = 4;
          local_37b8 = auVar41;
          args.ray = (RTCRayN *)ray;
          if (pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar6->occlusionFilterN)(&args);
          }
          if (local_37b8 == (undefined1  [16])0x0) {
            auVar41 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
            auVar41 = auVar41 ^ _DAT_01f7ae20;
          }
          else {
            p_Var7 = context->args->filter;
            if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var7)(&args);
            }
            auVar53 = vpcmpeqd_avx(local_37b8,_DAT_01f7aa10);
            auVar41 = auVar53 ^ _DAT_01f7ae20;
            auVar73._8_4_ = 0xff800000;
            auVar73._0_8_ = 0xff800000ff800000;
            auVar73._12_4_ = 0xff800000;
            auVar53 = vblendvps_avx(auVar73,*(undefined1 (*) [16])(args.ray + 0x80),auVar53);
            *(undefined1 (*) [16])(args.ray + 0x80) = auVar53;
          }
          auVar53 = vpslld_avx(auVar41,0x1f);
          auVar41 = vpsrad_avx(auVar53,0x1f);
          auVar51 = vblendvps_avx(auVar51,*(undefined1 (*) [16])pRVar1,auVar53);
          *(undefined1 (*) [16])pRVar1 = auVar51;
        }
        auVar90 = vpandn_avx(auVar41,auVar90);
        auVar41 = vpcmpeqd_avx(auVar51,auVar51);
      }
      auVar55 = ZEXT1664(auVar41);
      if (((((auVar90 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
            (auVar90 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
           (auVar90 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar90[0xf])
         || (bVar35 = 2 < uVar29, uVar29 = uVar29 + 1, bVar35)) break;
    }
    auVar41 = auVar55._0_16_;
    auVar51 = vpand_avx(auVar90,auVar63);
    auVar63 = auVar63 & auVar90;
    if ((((auVar63 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar63 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar63 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar63[0xf])
    break;
  }
  terminated.field_0 = (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)(auVar51 ^ auVar41);
LAB_0153d221:
  terminated.field_0 =
       (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
       vpor_avx((undefined1  [16])vVar23.field_0,(undefined1  [16])terminated.field_0);
  auVar41 = auVar41 & ~(undefined1  [16])terminated.field_0;
  if ((((auVar41 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
       (auVar41 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
      (auVar41 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar41[0xf])
  goto LAB_0153d326;
  auVar74._8_4_ = 0xff800000;
  auVar74._0_8_ = 0xff800000ff800000;
  auVar74._12_4_ = 0xff800000;
  aVar10.v = (__m128)vblendvps_avx(tray.tfar.field_0,auVar74,(undefined1  [16])terminated.field_0);
  auVar41 = vpcmpeqd_avx((undefined1  [16])tray.tfar.field_0,(undefined1  [16])tray.tfar.field_0);
  auVar55 = ZEXT1664(auVar41);
  tray.tfar.field_0 = aVar10;
  goto LAB_0153c631;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }